

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimer.cpp
# Opt level: O2

int __thiscall QTimer::qt_metacall(QTimer *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  
  _id_00 = QObject::qt_metacall(&this->super_QObject,_c,_id,_a);
  if ((-1 < (int)_id_00) && (_c < CustomCall)) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 < 4) {
          qt_static_metacall(&this->super_QObject,InvokeMetaMethod,_id_00,_a);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 < 4) {
          *(undefined8 *)*_a = 0;
        }
      }
      _id_00 = _id_00 - 4;
    }
    else {
      qt_static_metacall(&this->super_QObject,_c,_id_00,_a);
      _id_00 = _id_00 - 5;
    }
  }
  return _id_00;
}

Assistant:

int QTimer::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    return _id;
}